

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

result_t * sequenceFunc(result_t *__return_storage_ptr__,Env *env,shared_ptr<SpadeArguments> *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  reference pvVar9;
  ostream *poVar10;
  ulong uVar11;
  size_type sVar12;
  EVP_PKEY_CTX *pEVar13;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [39];
  undefined1 local_139;
  int local_138;
  uint local_134;
  int i;
  int external_block_size;
  ostringstream *seqstrm;
  ostringstream *logger;
  ostringstream *summary;
  shared_ptr<InvertDatabase> invdb;
  shared_ptr<Partition> partition;
  shared_ptr<ClassInfo> cls;
  undefined1 local_d8 [8];
  shared_ptr<std::vector<int,_std::allocator<int>_>_> numLargeItemset;
  Sequence sequence;
  shared_ptr<SpadeArguments> *args_local;
  Env *env_local;
  result_t *result;
  
  Sequence::Sequence((Sequence *)
                     &numLargeItemset.
                      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,env);
  std::make_shared<std::vector<int,std::allocator<int>>>();
  std::make_shared<ClassInfo>();
  std::make_shared<Partition>();
  std::make_shared<InvertDatabase,Env&>((Env *)&summary);
  this = &numLargeItemset.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  Sequence::set_args((Sequence *)this,args);
  this_00 = &partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Sequence::set_cls((Sequence *)this,(shared_ptr<ClassInfo> *)this_00);
  Sequence::set_invdb((Sequence *)this,(shared_ptr<InvertDatabase> *)&summary);
  Sequence::set_partition
            ((Sequence *)this,
             (shared_ptr<Partition> *)
             &invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Sequence::set_num_large_dataset
            ((Sequence *)this,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_d8);
  peVar4 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this_00);
  ClassInfo::setArgs(peVar4,args);
  peVar5 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  Partition::set_args(peVar5,args);
  peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&summary);
  InvertDatabase::set_cls
            (peVar6,(shared_ptr<ClassInfo> *)
                    &partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&summary);
  InvertDatabase::setArgs(peVar6,args);
  peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&summary);
  pEVar13 = (EVP_PKEY_CTX *)
            &invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  InvertDatabase::setPartition(peVar6,(shared_ptr<Partition> *)pEVar13);
  logger = &env->summary;
  seqstrm = &env->logger;
  _i = env;
  peVar4 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  ClassInfo::init(peVar4,pEVar13);
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  iVar3 = peVar7->num_partitions;
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  iVar1 = peVar7->total_trans_count;
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  iVar2 = peVar7->num_partitions;
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  local_134 = iVar3 + (iVar1 + -1 + iVar2) / peVar7->num_partitions;
  peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&summary);
  InvertDatabase::init(peVar6,(EVP_PKEY_CTX *)(ulong)local_134);
  pEVar13 = (EVP_PKEY_CTX *)local_d8;
  Sequence::set_num_large_dataset
            ((Sequence *)
             &numLargeItemset.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)pEVar13);
  peVar5 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  Partition::init(peVar5,pEVar13);
  peVar5 = std::__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Partition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  Partition::partition_alloc(peVar5);
  Sequence::read_files
            ((Sequence *)
             &numLargeItemset.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  if (peVar7->use_maxgap != '\0') {
    peVar6 = std::__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InvertDatabase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&summary);
    peVar4 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    iVar3 = ClassInfo::get_num_class(peVar4);
    peVar8 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    pvVar9 = std::vector<int,_std::allocator<int>_>::at(peVar8,0);
    InvertDatabase::init_buffer(peVar6,iVar3,*pvVar9);
  }
  Sequence::newSeq((Sequence *)
                   &numLargeItemset.
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::operator<<((ostream *)logger,"SPADE");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  if (peVar7->use_hash != 0) {
    std::operator<<((ostream *)logger," USEHASH");
  }
  poVar10 = std::operator<<((ostream *)logger," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = std::operator<<(poVar10,(string *)&peVar7->dataf);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->min_support_per_class);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->min_support);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->num_intersect);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->pruning_type);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->L2pruning);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->prepruning);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  std::ostream::operator<<(poVar10,peVar7->postpruning);
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  if (peVar7->use_window == '\0') {
    std::operator<<((ostream *)logger," 0");
    peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)args);
    if (peVar7->use_maxgap == '\0') {
      std::operator<<((ostream *)logger," -1");
    }
    else {
      poVar10 = std::operator<<((ostream *)logger," ");
      peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)args);
      std::ostream::operator<<(poVar10,peVar7->max_gap);
    }
  }
  else {
    poVar10 = std::operator<<((ostream *)logger," ");
    peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)args);
    poVar10 = std::operator<<(poVar10,peVar7->use_window);
    poVar10 = std::operator<<(poVar10," ");
    peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)args);
    std::ostream::operator<<(poVar10,peVar7->max_gap);
  }
  poVar10 = std::operator<<((ostream *)logger," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->min_gap);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,peVar7->max_iset_len);
  poVar10 = std::operator<<(poVar10," ");
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  std::ostream::operator<<(poVar10,peVar7->max_seq_len);
  local_138 = 0;
  while( true ) {
    uVar11 = (ulong)local_138;
    peVar8 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    sVar12 = std::vector<int,_std::allocator<int>_>::size(peVar8);
    if (sVar12 <= uVar11) break;
    poVar10 = std::operator<<((ostream *)logger," ");
    peVar8 = std::
             __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    pvVar9 = std::vector<int,_std::allocator<int>_>::at(peVar8,(long)local_138);
    std::ostream::operator<<(poVar10,*pvVar9);
    local_138 = local_138 + 1;
  }
  std::ostream::operator<<(logger,std::endl<char,std::char_traits<char>>);
  local_139 = 0;
  result_t::result_t(__return_storage_ptr__);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->summary,local_160);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->logger,local_180);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->seqstrm,local_1a0);
  std::__cxx11::string::~string(local_1a0);
  peVar7 = std::__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SpadeArguments,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)args);
  __return_storage_ptr__->nsequences = peVar7->total_trans_count;
  local_139 = 1;
  std::shared_ptr<InvertDatabase>::~shared_ptr((shared_ptr<InvertDatabase> *)&summary);
  std::shared_ptr<Partition>::~shared_ptr
            ((shared_ptr<Partition> *)
             &invdb.super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<ClassInfo>::~shared_ptr
            ((shared_ptr<ClassInfo> *)
             &partition.super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::~shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)local_d8);
  Sequence::~Sequence((Sequence *)
                      &numLargeItemset.
                       super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

result_t sequenceFunc(Env& env, const shared_ptr<SpadeArguments>& args) {
    Sequence sequence(env);
    shared_ptr<vint> numLargeItemset = make_shared<vint>();
    shared_ptr<ClassInfo> cls = make_shared<ClassInfo>();
    shared_ptr<Partition> partition = make_shared<Partition>();
    shared_ptr<InvertDatabase> invdb = make_shared<InvertDatabase>(env);
//    shared_ptr<ItemBufferManager> ibm = make_shared<ItemBufferManager>();

    sequence.set_args(args);
//    sequence.set_ibm(ibm);
    sequence.set_cls(cls);
    sequence.set_invdb(invdb);
    sequence.set_partition(partition);
    sequence.set_num_large_dataset(numLargeItemset);

    cls->setArgs(args);

    partition->set_args(args);

    invdb->set_cls(cls);
    invdb->setArgs(args);
    invdb->setPartition(partition);

    ostringstream &summary = env.summary;
    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    cls->init();

    int external_block_size =
            args->num_partitions + (args->total_trans_count + args->num_partitions - 1) / args->num_partitions;
    invdb->init(external_block_size);
    sequence.set_num_large_dataset(numLargeItemset);

    partition->init();
    partition->partition_alloc();

    int i;
    sequence.read_files();

    if (args->use_maxgap) {
        invdb->init_buffer(cls->get_num_class(), numLargeItemset->at(0));
    }

    sequence.newSeq();

    summary << "SPADE";

    if (args->use_hash) {
        summary << " USEHASH";
    }
    summary << " " << args->dataf << " " << args->min_support_per_class << " " << args->min_support << " "
            << args->num_intersect << " " << args->pruning_type << " " << args->L2pruning << " " << args->prepruning
            << " " << args->postpruning;
    if (args->use_window) {
        summary << " " << args->use_window << " " << args->max_gap;
    } else {
        summary << " 0";
        if (args->use_maxgap) {
            summary << " " << args->max_gap;
        } else {
            summary << " -1";
        }
    }

    summary << " " << args->min_gap << " " << args->max_iset_len << " " << args->max_seq_len;

    for (i = 0; i < numLargeItemset->size(); i++) {
        summary << " " << numLargeItemset->at(i);
    }
    summary << endl;
    result_t result;
    result.summary = summary.str();
    result.logger = logger.str();
    result.seqstrm = seqstrm.str();
    result.nsequences = args->total_trans_count;

    return result;
}